

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O3

void __thiscall JSONNode::merge(JSONNode *this,JSONNode *other)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  internalJSONNode *piVar3;
  internalJSONNode **ppiVar4;
  bool condition;
  JSONNode *pJVar5;
  json_string local_50;
  
  piVar3 = this->internal;
  paVar2 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"no internal","");
  JSONDebug::_JSON_ASSERT(piVar3 != (internalJSONNode *)0x0,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (this->internal != other->internal) {
    local_50.field_2._M_allocated_capacity._0_7_ = 0x65746e69206f6e;
    local_50.field_2._7_4_ = 0x6c616e72;
    local_50._M_string_length = 0xb;
    local_50.field_2._M_local_buf[0xb] = '\0';
    local_50._M_dataplus._M_p = (pointer)paVar2;
    JSONDebug::_JSON_ASSERT(this->internal != (internalJSONNode *)0x0,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    condition = internalJSONNode::IsEqualTo(this->internal,other->internal);
    local_50._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"merging two nodes that aren\'t equal","");
    JSONDebug::_JSON_ASSERT(condition,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (this->internal->refcount < other->internal->refcount) {
      local_50.field_2._M_allocated_capacity._0_7_ = 0x65746e69206f6e;
      local_50.field_2._7_4_ = 0x6c616e72;
      local_50._M_string_length = 0xb;
      local_50.field_2._M_local_buf[0xb] = '\0';
      local_50._M_dataplus._M_p = (pointer)paVar2;
      JSONDebug::_JSON_ASSERT(true,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      pJVar5 = other;
      if (this->internal == other->internal) {
        return;
      }
    }
    else {
      local_50.field_2._M_allocated_capacity._0_7_ = 0x65746e69206f6e;
      local_50.field_2._7_4_ = 0x6c616e72;
      local_50._M_string_length = 0xb;
      local_50.field_2._M_local_buf[0xb] = '\0';
      local_50._M_dataplus._M_p = (pointer)paVar2;
      JSONDebug::_JSON_ASSERT(true,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      ppiVar4 = &this->internal;
      pJVar5 = this;
      this = other;
      if (other->internal == *ppiVar4) {
        return;
      }
    }
    decRef(this);
    piVar3 = pJVar5->internal;
    psVar1 = &piVar3->refcount;
    *psVar1 = *psVar1 + 1;
    this->internal = piVar3;
  }
  return;
}

Assistant:

void JSONNode::merge(JSONNode &) json_nothrow {
#endif
    JSON_CHECK_INTERNAL();
    #ifdef JSON_REF_COUNT
	   if (internal == other.internal) return;
	   JSON_ASSERT(*this == other, JSON_TEXT("merging two nodes that aren't equal"));
	   if (internal -> refcount < other.internal -> refcount){
		  *this = other;
	   } else {
		  other = *this;
	   }
    #endif
}